

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectTfo_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar3 = Gia_ManObj(p,iObj);
    iVar1 = (int)*(ulong *)pGVar3;
    uVar4 = *(ulong *)pGVar3 & 0x1fffffff;
    if (-1 < iVar1 || uVar4 == 0x1fffffff) {
      if ((-1 < iVar1) && ((int)uVar4 != 0x1fffffff)) {
        iVar1 = 0;
        while( true ) {
          iVar2 = Vec_IntEntry(p->vFanoutNums,iObj);
          if (iVar2 <= iVar1) break;
          p_00 = p->vFanout;
          iVar2 = Vec_IntEntry(p_00,iObj);
          iVar2 = Vec_IntEntry(p_00,iVar2 + iVar1);
          Gia_ManCollectTfo_rec(p,iVar2,vNodes);
          iVar1 = iVar1 + 1;
        }
        Vec_IntPush(vNodes,iObj);
        return;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                    ,0x262,"void Gia_ManCollectTfo_rec(Gia_Man_t *, int, Vec_Int_t *)");
    }
  }
  return;
}

Assistant:

void Gia_ManCollectTfo_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj; int i, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCo(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        Gia_ManCollectTfo_rec( p, iFan, vNodes );
    Vec_IntPush( vNodes, iObj );
}